

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O3

void check_sysout(char *sysout_file_name,int verbose)

{
  uint __fd;
  __off_t _Var1;
  ssize_t sVar2;
  ulong uVar3;
  undefined1 *puVar4;
  char *__format;
  IFPAGE ifpage;
  undefined1 auStack_118 [22];
  ushort local_102;
  ushort local_ba;
  uint local_74;
  uint local_6c;
  
  puVar4 = auStack_118;
  __fd = open(sysout_file_name,0);
  if (__fd == 0xffffffff) {
    check_sysout_cold_3();
  }
  else {
    puVar4 = (undefined1 *)(ulong)__fd;
    _Var1 = lseek(__fd,0x200,0);
    if (_Var1 != -1) {
      puVar4 = (undefined1 *)(ulong)__fd;
      sVar2 = read(__fd,auStack_118,0xb0);
      if (sVar2 != -1) {
        word_swap_page(auStack_118,0x2c);
        close(__fd);
        uVar3 = (ulong)local_102;
        if (verbose == 0) {
          __format = "%d";
        }
        else {
          printf("ifpage.minbversion %d\n",uVar3);
          printf("ifpage.process_size %d\n",(ulong)local_6c);
          printf("ifpage.storagefullstate %d\n",(ulong)local_ba);
          uVar3 = (ulong)local_74;
          __format = "ifpage.nactivepages %d\n";
        }
        printf(__format,uVar3);
        return;
      }
      goto LAB_001012f1;
    }
  }
  check_sysout_cold_2();
LAB_001012f1:
  check_sysout_cold_1();
  fprintf(_stderr,"Usage: %s [-v] sysout-filename\n",puVar4);
  exit(-1);
}

Assistant:

void check_sysout(char *sysout_file_name, int verbose) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

  char errmsg[255];

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }
  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }
  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif
  close(sysout);
  if (verbose) {
      printf("ifpage.minbversion %d\n", ifpage.minbversion);
      printf("ifpage.process_size %d\n", ifpage.process_size);
      printf("ifpage.storagefullstate %d\n", ifpage.storagefullstate);
      printf("ifpage.nactivepages %d\n", ifpage.nactivepages);
  } else {
      printf("%d", ifpage.minbversion);
  }
}